

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ViewportCallOrderCase::iterate
          (ViewportCallOrderCase *this)

{
  RenderContext *context;
  bool bVar1;
  undefined4 height;
  byte bVar2;
  int iVar3;
  undefined4 uVar4;
  deUint32 err;
  undefined4 extraout_var;
  RenderTarget *pRVar6;
  TestLog *pTVar7;
  int iVar8;
  ConstPixelBufferAccess *access;
  Surface *surface;
  LogImageSet *access_00;
  void *__buf;
  void *__buf_00;
  char *description;
  void *__buf_01;
  int z;
  qpTestResult testResult;
  void *pvVar9;
  bool bVar10;
  float fVar11;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  int extraout_XMM0_Dc;
  int extraout_XMM0_Dd;
  Surface resultSurface;
  Surface errorMask;
  size_type __dnew;
  IVec4 pixel;
  Surface local_450;
  float local_438;
  float fStack_434;
  int iStack_430;
  int iStack_42c;
  string local_428;
  Surface local_408;
  string local_3f0;
  string local_3d0;
  undefined1 local_3b0 [40];
  string local_388;
  string local_368;
  string local_348;
  LogImageSet local_328;
  LogImage local_2e8;
  float local_258;
  float fStack_254;
  LogImage local_240;
  undefined1 local_1b0 [8];
  int local_1a8;
  ios_base local_138 [264];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = pRVar6->m_width;
  pRVar6 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar8 = pRVar6->m_height;
  uVar4 = (**(code **)(lVar5 + 0x780))
                    ((((this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       .m_data.ptr)->m_program).m_program,"a_position");
  tcu::Surface::Surface(&local_450,iVar3,iVar8);
  (**(code **)(lVar5 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar5 + 0x188))(0x4000);
  iVar3 = iVar3 / 2;
  bVar2 = 0;
  local_438 = (float)uVar4;
  bVar10 = true;
  do {
    bVar1 = bVar10;
    if ((bool)(this->m_callOrder == BBOX_FIRST & bVar2 | this->m_callOrder == VIEWPORT_FIRST & bVar1
              )) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "Setting viewport to cover the left half of the render target.\n",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\t(0, 0, ",8);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", ",2);
      std::ostream::operator<<((ostringstream *)&local_1a8,iVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      (**(code **)(lVar5 + 0x1a00))(0,0,iVar3,iVar8);
    }
    else {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "Setting bounding box to cover the right half of the clip space.\n",0x40);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"\t(0.0, -1.0, -1.0, 1.0) .. (1.0, 1.0, 1.0f, 1.0)",0x30);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      (**(code **)(lVar5 + 0x1040))
                (0,0xbf800000,0xbf800000,0x3f800000,0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    }
    bVar2 = 1;
    bVar10 = false;
  } while (bVar1);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Rendering mesh covering the right half of the clip space.",0x39)
  ;
  fVar11 = local_438;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar5 + 0x40))
            (0x8892,(((this->m_vbo).
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                      .m_data.ptr)->super_ObjectWrapper).m_object);
  (**(code **)(lVar5 + 0x19f0))(fVar11,4,0x1406,0,0x10,0);
  (**(code **)(lVar5 + 0x610))(fVar11);
  (**(code **)(lVar5 + 0x1680))
            ((((this->m_program).
               super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.
              ptr)->m_program).m_program);
  (**(code **)(lVar5 + 0xfd8))(0x8e72,3);
  (**(code **)(lVar5 + 0x538))(0xe,0,this->m_numVertices);
  err = (**(code **)(lVar5 + 0x800))();
  glu::checkError(err,"post-draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x128e);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Verifying image",0xf);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2e8.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar9 = (void *)local_450.m_pixels.m_cap;
  if ((void *)local_450.m_pixels.m_cap != (void *)0x0) {
    pvVar9 = local_450.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2e8,local_450.m_width,
             local_450.m_height,1,pvVar9);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
  local_1b0._0_4_ = RGBA;
  local_1b0._4_4_ = UNORM_INT8;
  pvVar9 = (void *)local_450.m_pixels.m_cap;
  if ((void *)local_450.m_pixels.m_cap != (void *)0x0) {
    pvVar9 = local_450.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_3b0,(TextureFormat *)local_1b0,local_450.m_width,
             local_450.m_height,1,pvVar9);
  height = local_3b0._12_4_;
  uVar4 = local_3b0._8_4_;
  local_438 = (float)(int)local_3b0._8_4_ * 0.25;
  local_258 = ceilf(local_438);
  fStack_254 = extraout_XMM0_Db;
  local_438 = floorf(local_438);
  fStack_434 = extraout_XMM0_Db_00;
  iStack_430 = extraout_XMM0_Dc;
  iStack_42c = extraout_XMM0_Dd;
  tcu::Surface::Surface(&local_408,uVar4,height);
  local_2e8.m_name._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_408.m_pixels.m_cap != (void *)0x0) {
    local_408.m_pixels.m_cap = (size_t)local_408.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2e8,local_408.m_width,
             local_408.m_height,1,(void *)local_408.m_pixels.m_cap);
  local_240.m_name._M_dataplus._M_p._0_4_ = 0xff00ff00;
  tcu::RGBA::toIVec((RGBA *)&local_2e8);
  tcu::clear((PixelBufferAccess *)local_1b0,(IVec4 *)&local_2e8);
  if (0 < (int)local_3b0._12_4_) {
    iStack_430 = (int)fStack_434;
    iStack_42c = (int)fStack_254;
    local_438 = (float)((int)local_438 + -1);
    fStack_434 = (float)((int)local_258 + 1);
    bVar10 = false;
    z = 0;
    iVar3 = local_3b0._12_4_;
    iVar8 = local_3b0._8_4_;
    do {
      if (0 < iVar8) {
        fVar11 = 0.0;
        do {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_1b0,(int)local_3b0,(int)fVar11,z);
          if (((fVar11 == fStack_434) && ((local_1b0._4_4_ != 0xff || (local_1a8 != 0)))) ||
             ((fVar11 == local_438 &&
              (((local_1b0._0_4_ != R || (local_1b0._4_4_ != SNORM_INT8)) || (local_1a8 != 0)))))) {
            *(undefined4 *)
             ((long)local_408.m_pixels.m_ptr + (long)(local_408.m_width * z + (int)fVar11) * 4) =
                 0xff0000ff;
            bVar10 = true;
          }
          fVar11 = (float)((int)fVar11 + 1);
          iVar3 = local_3b0._12_4_;
          iVar8 = local_3b0._8_4_;
        } while ((int)fVar11 < (int)local_3b0._8_4_);
      }
      z = z + 1;
    } while (z < iVar3);
    if (bVar10) {
      local_1b0 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Image verification failed.",0x1a);
      pTVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      local_428.field_2._M_allocated_capacity._0_4_ = 0x67616d49;
      local_428.field_2._M_allocated_capacity._4_2_ = 0x7365;
      local_428._M_string_length = 6;
      local_428.field_2._M_local_buf[6] = '\0';
      local_2e8.m_name._M_dataplus._M_p = (pointer)0x12;
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
      local_3f0._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f0,(ulong)&local_2e8);
      local_3f0.field_2._M_allocated_capacity = (size_type)local_2e8.m_name._M_dataplus._M_p;
      *(undefined8 *)local_3f0._M_dataplus._M_p = 0x6576206567616d49;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p + 8) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p + 9) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p + 10) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p + 0xb) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p + 0xc) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p + 0xd) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p + 0xe) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p + 0xf) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p + 0x10) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f0._M_dataplus._M_p + 0x11) = 'n';
      local_3f0._M_string_length = (size_type)local_2e8.m_name._M_dataplus._M_p;
      local_3f0._M_dataplus._M_p[(long)local_2e8.m_name._M_dataplus._M_p] = '\0';
      tcu::LogImageSet::LogImageSet(&local_328,&local_428,&local_3f0);
      tcu::TestLog::startImageSet
                (pTVar7,local_328.m_name._M_dataplus._M_p,local_328.m_description._M_dataplus._M_p);
      local_3d0.field_2._M_allocated_capacity._0_7_ = 0x49746c75736552;
      local_3d0.field_2._7_4_ = 0x6567616d;
      local_3d0._M_string_length = 0xb;
      local_3d0.field_2._M_local_buf[0xb] = '\0';
      local_388.field_2._M_allocated_capacity = 0x6920746c75736552;
      local_388.field_2._8_4_ = 0x6567616d;
      local_388._M_string_length = 0xc;
      local_388.field_2._M_local_buf[0xc] = '\0';
      access = (ConstPixelBufferAccess *)local_3b0;
      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
      local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      tcu::LogImage::LogImage
                (&local_2e8,&local_3d0,&local_388,access,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_2e8,(int)pTVar7,__buf,(size_t)access);
      local_348.field_2._M_allocated_capacity = 0x73614d726f727245;
      local_348.field_2._8_2_ = 0x6b;
      local_348._M_string_length = 9;
      local_368.field_2._M_allocated_capacity = 0x616d20726f727245;
      local_368.field_2._8_2_ = 0x6b73;
      local_368._M_string_length = 10;
      local_368.field_2._M_local_buf[10] = '\0';
      surface = &local_408;
      local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      tcu::LogImage::LogImage
                (&local_240,&local_348,&local_368,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write(&local_240,(int)pTVar7,__buf_00,(size_t)surface);
      tcu::TestLog::endImageSet(pTVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
        operator_delete(local_240.m_description._M_dataplus._M_p,
                        local_240.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_240.m_name._M_dataplus._M_p._4_4_,
                      local_240.m_name._M_dataplus._M_p._0_4_) != &local_240.m_name.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_240.m_name._M_dataplus._M_p._4_4_,
                                 local_240.m_name._M_dataplus._M_p._0_4_),
                        local_240.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_368._M_dataplus._M_p != &local_368.field_2) {
        operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8.m_description._M_dataplus._M_p != &local_2e8.m_description.field_2) {
        operator_delete(local_2e8.m_description._M_dataplus._M_p,
                        local_2e8.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8.m_name._M_dataplus._M_p != &local_2e8.m_name.field_2) {
        operator_delete(local_2e8.m_name._M_dataplus._M_p,
                        local_2e8.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p,
                        CONCAT17(local_3d0.field_2._M_local_buf[7],
                                 local_3d0.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328.m_description._M_dataplus._M_p != &local_328.m_description.field_2) {
        operator_delete(local_328.m_description._M_dataplus._M_p,
                        local_328.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328.m_name._M_dataplus._M_p != &local_328.m_name.field_2) {
        operator_delete(local_328.m_name._M_dataplus._M_p,
                        local_328.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,
                        (ulong)(local_3f0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,
                        CONCAT17(local_428.field_2._M_local_buf[7],
                                 CONCAT16(local_428.field_2._M_local_buf[6],
                                          CONCAT24(local_428.field_2._M_allocated_capacity._4_2_,
                                                   local_428.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      tcu::Surface::~Surface(&local_408);
      description = "Image verification failed";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_016526f0;
    }
  }
  tcu::Surface::~Surface(&local_408);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Result ok.",10);
  pTVar7 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_3b0._0_8_ = (long)local_3b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"Images","");
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Image verification","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,(string *)local_3b0,&local_428);
  tcu::TestLog::startImageSet
            (pTVar7,(char *)CONCAT44(local_240.m_name._M_dataplus._M_p._4_4_,
                                     local_240.m_name._M_dataplus._M_p._0_4_),
             local_240.m_description._M_dataplus._M_p);
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"Result","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"Result","");
  local_388._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_450.m_pixels.m_cap != (void *)0x0) {
    local_450.m_pixels.m_cap = (size_t)local_450.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_328,(TextureFormat *)&local_388,local_450.m_width,
             local_450.m_height,1,(void *)local_450.m_pixels.m_cap);
  access_00 = &local_328;
  tcu::LogImage::LogImage
            (&local_2e8,&local_3f0,&local_3d0,(ConstPixelBufferAccess *)access_00,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_2e8,(int)pTVar7,__buf_01,(size_t)access_00);
  tcu::TestLog::endImageSet(pTVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8.m_description._M_dataplus._M_p != &local_2e8.m_description.field_2) {
    operator_delete(local_2e8.m_description._M_dataplus._M_p,
                    local_2e8.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8.m_name._M_dataplus._M_p != &local_2e8.m_name.field_2) {
    operator_delete(local_2e8.m_name._M_dataplus._M_p,
                    local_2e8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,
                    CONCAT17(local_3d0.field_2._M_local_buf[7],
                             local_3d0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,(ulong)(local_3f0.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
    operator_delete(local_240.m_description._M_dataplus._M_p,
                    local_240.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_240.m_name._M_dataplus._M_p._4_4_,local_240.m_name._M_dataplus._M_p._0_4_)
      != &local_240.m_name.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_240.m_name._M_dataplus._M_p._4_4_,
                             local_240.m_name._M_dataplus._M_p._0_4_),
                    local_240.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,
                    CONCAT17(local_428.field_2._M_local_buf[7],
                             CONCAT16(local_428.field_2._M_local_buf[6],
                                      CONCAT24(local_428.field_2._M_allocated_capacity._4_2_,
                                               local_428.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if (local_3b0._0_8_ != (long)local_3b0 + 0x10) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_016526f0:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  tcu::Surface::~Surface(&local_450);
  return STOP;
}

Assistant:

ViewportCallOrderCase::IterateResult ViewportCallOrderCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const tcu::IVec2		viewportSize	= tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
	const glw::GLint		posLocation		= gl.getAttribLocation(m_program->getProgram(), "a_position");
	tcu::Surface			resultSurface	(viewportSize.x(), viewportSize.y());

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// set state
	for (int orderNdx = 0; orderNdx < 2; ++orderNdx)
	{
		if ((orderNdx == 0 && m_callOrder == VIEWPORT_FIRST) ||
			(orderNdx == 1 && m_callOrder == BBOX_FIRST))
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Setting viewport to cover the left half of the render target.\n"
				<< "\t(0, 0, " << (viewportSize.x()/2) << ", " << viewportSize.y() << ")"
				<< tcu::TestLog::EndMessage;

			gl.viewport(0, 0, viewportSize.x()/2, viewportSize.y());
		}
		else
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Setting bounding box to cover the right half of the clip space.\n"
				<< "\t(0.0, -1.0, -1.0, 1.0) .. (1.0, 1.0, 1.0f, 1.0)"
				<< tcu::TestLog::EndMessage;

			gl.primitiveBoundingBox(0.0f, -1.0f, -1.0f, 1.0f,
									1.0f,  1.0f,  1.0f, 1.0f);
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering mesh covering the right half of the clip space."
		<< tcu::TestLog::EndMessage;

	gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, sizeof(float[4]), (const float*)DE_NULL);
	gl.enableVertexAttribArray(posLocation);
	gl.useProgram(m_program->getProgram());
	gl.patchParameteri(GL_PATCH_VERTICES, 3);
	gl.drawArrays(GL_PATCHES, 0, m_numVertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "post-draw");

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying image"
		<< tcu::TestLog::EndMessage;
	glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());

	if (!verifyImage(resultSurface.getAccess()))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Result ok."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Result", "Result", resultSurface.getAccess())
			<< tcu::TestLog::EndImageSet;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	return STOP;
}